

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O1

vec6F * __thiscall
crnlib::dxt_hc::palettize_color
          (vec6F *__return_storage_ptr__,dxt_hc *this,color_quad_u8 *pixels,uint pixels_count)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  undefined8 uVar4;
  uint i;
  ulong uVar5;
  long lVar6;
  uint size;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  vec3F result [2];
  vec<3U,_float> temp;
  uint color [64];
  uint weights [64];
  vec3F vectors [64];
  vec<3U,_float> local_568;
  float local_55c;
  float fStack_558;
  float local_554;
  int iStack_53c;
  ushort auStack_536 [127];
  uint local_438 [64];
  vec<3U,_float> local_338 [64];
  
  uVar7 = (ulong)pixels_count;
  if (pixels_count != 0) {
    uVar5 = 0;
    do {
      *(uint *)((long)&stack0xfffffffffffffac8 + uVar5 * 4) =
           (uint)pixels[uVar5].field_0.field_0.b |
           (uint)pixels[uVar5].field_0.field_0.g << 8 |
           (uint)pixels[uVar5].field_0.field_0.r << 0x10;
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
    lVar6 = 0x3f;
    if (uVar7 != 0) {
      for (; pixels_count >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (&stack0xfffffffffffffac8,(undefined4 *)((long)&stack0xfffffffffffffac8 + uVar7 * 4),
               ((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (&stack0xfffffffffffffac8,(undefined4 *)((long)&stack0xfffffffffffffac8 + uVar7 * 4));
  }
  if (pixels_count == 0) {
    size = 0;
  }
  else {
    bVar1 = (this->m_params).m_perceptual;
    uVar5 = 0;
    size = 0;
    do {
      if ((uVar5 == 0) ||
         (*(int *)((long)&stack0xfffffffffffffac8 + uVar5 * 4) != (&iStack_53c)[uVar5])) {
        uVar2 = *(ushort *)((long)local_438 + uVar5 * 4 + -0xfe);
        if ((bVar1 & 1U) == 0) {
          fVar10 = this->m_uint8_to_float[uVar2];
        }
        else {
          fVar10 = this->m_uint8_to_float[uVar2] * 0.5;
        }
        local_338[size].m_s[0] = fVar10;
        uVar3 = *(uint *)((long)&stack0xfffffffffffffac8 + uVar5 * 4);
        local_338[size].m_s[1] = this->m_uint8_to_float[uVar3 >> 8 & 0xff];
        fVar10 = this->m_uint8_to_float[uVar3 & 0xff] * 0.25;
        if ((bVar1 & 1U) == 0) {
          fVar10 = this->m_uint8_to_float[uVar3 & 0xff];
        }
        local_338[size].m_s[2] = fVar10;
        local_438[size] = 1;
        size = size + 1;
      }
      else {
        local_438[size - 1] = local_438[size - 1] + 1;
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  split_vectors<crnlib::vec<3u,float>>
            (&local_338,&local_438,size,(vec<3U,_float> (*) [2])&local_568);
  fVar10 = local_568.m_s[2];
  fVar8 = local_568.m_s[0] * local_568.m_s[0];
  lVar6 = 1;
  do {
    fVar8 = fVar8 + local_568.m_s[lVar6] * local_568.m_s[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  fVar9 = local_55c * local_55c;
  lVar6 = 4;
  do {
    fVar9 = fVar9 + local_568.m_s[lVar6] * local_568.m_s[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  uVar4 = local_568.m_s._0_8_;
  if (SQRT(fVar9) < SQRT(fVar8)) {
    local_568.m_s[2] = local_554;
    uVar4._4_4_ = fStack_558;
    uVar4._0_4_ = local_55c;
    fStack_558 = local_568.m_s[1];
    local_554 = fVar10;
    local_55c = local_568.m_s[0];
  }
  local_568.m_s._0_8_ = uVar4;
  *(ulong *)(__return_storage_ptr__->m_s + 4) = CONCAT44(local_554,fStack_558);
  *(undefined8 *)__return_storage_ptr__->m_s = local_568.m_s._0_8_;
  __return_storage_ptr__->m_s[2] = local_568.m_s[2];
  __return_storage_ptr__->m_s[3] = local_55c;
  return __return_storage_ptr__;
}

Assistant:

vec6F dxt_hc::palettize_color(color_quad_u8* pixels, uint pixels_count) {
  uint color[64];
  for (uint i = 0; i < pixels_count; i++)
    color[i] = pixels[i][0] << 16 | pixels[i][1] << 8 | pixels[i][2];
  std::sort(color, color + pixels_count);
  vec3F vectors[64];
  uint weights[64];
  uint size = 0;
  for (uint i = 0; i < pixels_count; i++) {
    if (!i || color[i] != color[i - 1]) {
      vectors[size][0] = m_params.m_perceptual ? m_uint8_to_float[color[i] >> 16] * 0.5f : m_uint8_to_float[color[i] >> 16];
      vectors[size][1] = m_uint8_to_float[color[i] >> 8 & 0xFF];
      vectors[size][2] = m_params.m_perceptual ? m_uint8_to_float[color[i] & 0xFF] * 0.25f : m_uint8_to_float[color[i] & 0xFF];
      weights[size] = 1;
      size++;
    } else {
      weights[size - 1]++;
    }
  }
  vec3F result[2];
  split_vectors<vec3F>(vectors, weights, size, result);
  if (result[0].length() > result[1].length())
    utils::swap(result[0], result[1]);
  return *(vec6F*)result;
}